

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O3

void fl_measure(char *str,int *w,int *h,int draw_symbols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  bool bVar8;
  double dVar9;
  double width;
  char *linebuf;
  int buflen;
  double local_48;
  char *local_40;
  int local_34;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    *w = 0;
    *h = 0;
    return;
  }
  iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  *h = iVar2;
  iVar6 = 0;
  local_40 = (char *)0x0;
  local_48 = 0.0;
  if (draw_symbols == 0) {
    iVar2 = 0;
    iVar3 = 0;
  }
  else {
    if (*str == '@') {
      if (str[1] == '@') {
        pcVar4 = str + (ulong)(str[1] == '@') * 2;
        iVar3 = 0;
      }
      else {
        cVar7 = '@';
        do {
          iVar3 = isspace((int)cVar7);
          if (iVar3 != 0) goto LAB_001955e9;
          cVar7 = str[1];
          str = str + 1;
        } while (cVar7 != '\0');
        cVar7 = '\0';
LAB_001955e9:
        iVar3 = isspace((int)cVar7);
        str = str + (iVar3 != 0);
        pcVar4 = str;
        iVar3 = iVar2;
      }
    }
    else {
      iVar3 = 0;
      pcVar4 = str;
    }
    pcVar4 = strchr(pcVar4,0x40);
    if (pcVar4 == (char *)0x0) {
      iVar2 = 0;
    }
    else if (pcVar4[1] == '@') {
      iVar2 = 0;
    }
  }
  iVar5 = 1;
  do {
    str = expand_text_(str,&local_40,0,(double)(*w - (iVar3 + iVar2)),&local_34,&local_48,
                       (uint)(*w != 0),draw_symbols);
    dVar9 = ceil(local_48);
    iVar1 = (int)dVar9;
    if ((int)dVar9 < iVar6) {
      iVar1 = iVar6;
    }
    iVar6 = iVar1;
    if (*str == '@') {
      if ((draw_symbols != 0) && (str[1] != '@')) {
LAB_001956a6:
        if (iVar3 != 0 || iVar2 != 0) {
          bVar8 = iVar3 != 0;
          iVar3 = 0;
          if (bVar8) {
            iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
            iVar3 = iVar3 * iVar5;
          }
          if (iVar2 == 0) {
            iVar2 = 0;
          }
          else {
            iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
            iVar2 = iVar2 * iVar5;
          }
        }
        *w = iVar2 + iVar3 + iVar6;
        *h = iVar5 * *h;
        return;
      }
    }
    else if (*str == '\0') goto LAB_001956a6;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void fl_measure(const char* str, int& w, int& h, int draw_symbols) {
  if (!str || !*str) {w = 0; h = 0; return;}
  h = fl_height();
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  int lines;
  double width=0;
  int W = 0;
  int symwidth[2], symtotal;

  symwidth[0] = 0;	// size of symbol at beginning of string (if any)
  symwidth[1] = 0;	// size of symbol at end of string (if any)

  if (draw_symbols) {
    // Symbol at beginning of string?
    const char *sym2 = (str[0]=='@' && str[1]=='@') ? str+2 : str;	// sym2 check will skip leading @@
    if (str[0] == '@' && str[1] != '@') {
      while (*str && !isspace(*str)) { ++str; }		// skip over symbol
      if (isspace(*str)) ++str;				// skip over trailing space
      sym2 = str;					// sym2 check will skip leading symbol
      symwidth[0] = h;
    }
    // Symbol at end of string?
    if ((p=strchr(sym2,'@')) != NULL && p[1] != '@') {
      symwidth[1] = h;
    }
  }

  symtotal = symwidth[0] + symwidth[1];

  for (p = str, lines=0; p;) {
//    e = expand(p, linebuf, w - symtotal, buflen, width, w != 0, draw_symbols);
    e = expand_text_(p, linebuf, 0, w - symtotal, buflen, width,
			w != 0, draw_symbols);
    if ((int)ceil(width) > W) W = (int)ceil(width);
    lines++;
    if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
    p = e;
  }

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];

  w = W + symtotal;
  h = lines*h;
}